

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O1

bool compareData<int>(Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
                     DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,double tolerance,
                     vector<bool,_std::allocator<bool>_> *failed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  _Bit_type *p_Var11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  double dVar25;
  int *data2;
  int *data1;
  int *local_70;
  int *local_68;
  double local_60;
  IJKLBounds *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_60 = tolerance;
  readData<int>(serializer1,info1,savepoint,&local_68);
  readData<int>(serializer2,info2,savepoint,&local_70);
  iVar1 = info1->jSize_;
  iVar21 = info1->kSize_;
  iVar2 = info1->lSize_;
  iVar19 = iVar21 * iVar2;
  std::vector<bool,_std::allocator<bool>_>::resize
            (failed,(long)(info1->iSize_ * iVar1 * iVar19),false);
  uVar3 = bounds->iLower;
  uVar4 = bounds->iUpper;
  bVar24 = true;
  if ((int)uVar3 <= (int)uVar4) {
    uVar5 = bounds->jLower;
    uVar6 = bounds->jUpper;
    uVar7 = bounds->kLower;
    local_40 = (ulong)uVar7;
    uVar8 = bounds->kUpper;
    local_48 = (ulong)uVar8;
    iVar21 = (iVar21 * (iVar1 * uVar3 + uVar5) + uVar7) * iVar2;
    bVar15 = 0;
    do {
      local_50 = (ulong)uVar3;
      if ((int)uVar5 <= (int)uVar6) {
        iVar9 = bounds->lLower;
        iVar10 = bounds->lUpper;
        iVar23 = iVar21;
        uVar12 = uVar5;
        do {
          local_38 = (ulong)uVar12;
          if ((int)uVar7 <= (int)uVar8) {
            p_Var11 = (failed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            uVar18 = local_40;
            iVar22 = iVar23;
            do {
              if (iVar9 <= iVar10) {
                uVar13 = (long)iVar22 + (long)iVar9;
                iVar16 = (iVar10 - iVar9) + 1;
                do {
                  dVar25 = (double)local_70[uVar13];
                  dVar25 = ABS((dVar25 - (double)local_68[uVar13]) /
                               (double)(~-(ulong)(1.0 < ABS(dVar25)) & 0x3ff0000000000000 |
                                       -(ulong)(1.0 < ABS(dVar25)) & (ulong)dVar25));
                  uVar17 = uVar13 + 0x3f;
                  if (-1 < (long)uVar13) {
                    uVar17 = uVar13;
                  }
                  lVar14 = (long)uVar17 >> 6;
                  uVar20 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
                  uVar17 = 1L << ((byte)uVar13 & 0x3f);
                  if (dVar25 <= local_60) {
                    uVar17 = ~uVar17 & p_Var11[lVar14 + uVar20 + 0xffffffffffffffff];
                  }
                  else {
                    uVar17 = uVar17 | p_Var11[lVar14 + uVar20 + 0xffffffffffffffff];
                  }
                  p_Var11[lVar14 + uVar20 + 0xffffffffffffffff] = uVar17;
                  bVar15 = bVar15 | local_60 < dVar25;
                  uVar13 = uVar13 + 1;
                  iVar16 = iVar16 + -1;
                } while (iVar16 != 0);
              }
              uVar18 = uVar18 + 1;
              iVar22 = iVar22 + iVar2;
            } while (uVar8 + 1 != (int)uVar18);
          }
          iVar23 = iVar23 + iVar19;
          bVar24 = uVar12 != uVar6;
          uVar12 = uVar12 + 1;
        } while (bVar24);
      }
      iVar21 = iVar21 + iVar19 * iVar1;
      bVar24 = uVar3 != uVar4;
      uVar3 = uVar3 + 1;
    } while (bVar24);
    bVar24 = (bool)(bVar15 ^ 1);
    local_58 = bounds;
  }
  if (local_68 != (int *)0x0) {
    operator_delete__(local_68);
  }
  if (local_70 != (int *)0x0) {
    operator_delete__(local_70);
  }
  return bVar24;
}

Assistant:

bool compareData(const Serializer& serializer1, const Serializer& serializer2,
                 const Savepoint& savepoint,
                 const DataFieldInfo& info1, const DataFieldInfo& info2,
                 const IJKLBounds& bounds,
                 double tolerance, vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    bool notequal = false;
    failed.resize(iSize * jSize * kSize * lSize);

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;

                    const double val = static_cast<double>(data1[index]);
                    const double ref = static_cast<double>(data2[index]);
                    const double err = std::fabs(ref) > 1. ?
                                       std::fabs((ref - val) / ref) : std::fabs(ref - val);

                    const bool f = err > tolerance         // Error is too large (e.g. val is infinite, ref is not)
                        || ((val != val) != (ref != ref))  // Exactly one is NaN
                        || (err != err && ref != val);     // ref is infinite, val different

                    failed[index] = f;
                    notequal = notequal || f;
                }
            }
        }
    }

    delete [] data1;
    delete [] data2;

    return !notequal;
}